

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

void __thiscall ON_FontList::ON_FontList(ON_FontList *this)

{
  ON_FontListImpl *__s;
  
  this->m_name_locale = LocalizedFirst;
  this->m_bMatchUnderlineStrikethroughAndPointSize = false;
  (this->m_by_index)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920;
  (this->m_by_index).m_a = (ON_Font **)0x0;
  (this->m_by_index).m_count = 0;
  (this->m_by_index).m_capacity = 0;
  (this->m_unsorted)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920;
  (this->m_unsorted).m_a = (ON_Font **)0x0;
  (this->m_unsorted).m_count = 0;
  (this->m_unsorted).m_capacity = 0;
  __s = (ON_FontListImpl *)operator_new(0xc0);
  memset(__s,0,0xc0);
  (__s->m_by_font_characteristics_hash)._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_0081e920;
  (__s->m_by_font_characteristics_hash).m_a = (ON_Font **)0x0;
  (__s->m_by_font_characteristics_hash).m_count = 0;
  (__s->m_by_font_characteristics_hash).m_capacity = 0;
  (__s->m_by_postscript_name)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920;
  (__s->m_by_postscript_name).m_a = (ON_Font **)0x0;
  (__s->m_by_postscript_name).m_count = 0;
  (__s->m_by_postscript_name).m_capacity = 0;
  (__s->m_by_windows_logfont_name)._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_0081e920;
  (__s->m_by_windows_logfont_name).m_a = (ON_Font **)0x0;
  (__s->m_by_windows_logfont_name).m_count = 0;
  (__s->m_by_windows_logfont_name).m_capacity = 0;
  (__s->m_by_family_name)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920;
  (__s->m_by_family_name).m_a = (ON_Font **)0x0;
  (__s->m_by_family_name).m_count = 0;
  (__s->m_by_family_name).m_capacity = 0;
  (__s->m_by_english_postscript_name)._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_0081e920;
  (__s->m_by_english_postscript_name).m_a = (ON_Font **)0x0;
  (__s->m_by_english_postscript_name).m_count = 0;
  (__s->m_by_english_postscript_name).m_capacity = 0;
  (__s->m_by_english_windows_logfont_name)._vptr_ON_SimpleArray =
       (_func_int **)&PTR__ON_SimpleArray_0081e920;
  (__s->m_by_english_windows_logfont_name).m_a = (ON_Font **)0x0;
  (__s->m_by_english_windows_logfont_name).m_count = 0;
  (__s->m_by_english_windows_logfont_name).m_capacity = 0;
  (__s->m_by_english_family_name)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920
  ;
  (__s->m_by_english_family_name).m_a = (ON_Font **)0x0;
  (__s->m_by_english_family_name).m_count = 0;
  (__s->m_by_english_family_name).m_capacity = 0;
  (__s->m_by_quartet_name)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920;
  (__s->m_by_quartet_name).m_a = (ON_Font **)0x0;
  (__s->m_by_quartet_name).m_count = 0;
  (__s->m_by_quartet_name).m_capacity = 0;
  this->m_sorted = __s;
  memset(this->m_reserved,0,0xa0);
  (this->m_quartet_list)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0081ea40;
  (this->m_quartet_list).m_a = (ON_FontFaceQuartet *)0x0;
  (this->m_quartet_list).m_count = 0;
  (this->m_quartet_list).m_capacity = 0;
  return;
}

Assistant:

ON_FontList::ON_FontList()
  : m_sorted(*(new ON_FontListImpl()))
{}